

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

void __thiscall Fl_Preferences::Node::deleteAllChildren(Node *this)

{
  Node *pNVar1;
  Node *this_00;
  
  this_00 = this->child_;
  while (this_00 != (Node *)0x0) {
    pNVar1 = this_00->next_;
    ~Node(this_00);
    operator_delete(this_00,0x48);
    this_00 = pNVar1;
  }
  this->child_ = (Node *)0x0;
  this->field_0x30 = (this->field_0x30 & 0xfa) + 1;
  return;
}

Assistant:

void Fl_Preferences::Node::deleteAllChildren() {
  Node *nx;
  for ( Node *nd = child_; nd; nd = nx ) {
    nx = nd->next_;
    delete nd;
  }
  child_ = 0L;
  dirty_ = 1;
  updateIndex();
}